

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O0

int arkPredict_VariableOrder(ARKodeMem ark_mem,sunrealtype tau,N_Vector yguess)

{
  ARKInterp in_RSI;
  ARKodeMem in_RDI;
  ARKodeMem_conflict in_XMM0_Qa;
  sunrealtype tau_tol2;
  sunrealtype tau_tol;
  int ord;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 uVar1;
  int local_4;
  
  if (in_RDI == (ARKodeMem)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,0xb37,"arkPredict_VariableOrder",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode.c"
                    ,"ARKodeMem structure is NULL");
    local_4 = -0x15;
  }
  else if (in_RDI->interp == (ARKInterp)0x0) {
    arkProcessError(in_RDI,-0x15,0xb3d,"arkPredict_VariableOrder",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode.c"
                    ,"ARKodeInterpMem structure is NULL");
    local_4 = -0x15;
  }
  else {
    if (0.5 < (double)in_XMM0_Qa) {
      if (0.75 < (double)in_XMM0_Qa) {
        uVar1 = 1;
      }
      else {
        uVar1 = 2;
      }
    }
    else {
      uVar1 = 3;
    }
    local_4 = arkInterpEvaluate(in_XMM0_Qa,in_RSI,
                                (sunrealtype)CONCAT44(uVar1,in_stack_ffffffffffffffd8),0x3fe00000,0,
                                (N_Vector)&DAT_3fe8000000000000);
  }
  return local_4;
}

Assistant:

int arkPredict_VariableOrder(ARKodeMem ark_mem, sunrealtype tau, N_Vector yguess)
{
  int ord;
  sunrealtype tau_tol  = HALF;
  sunrealtype tau_tol2 = SUN_RCONST(0.75);

  /* verify that ark_mem and interpolation structure are provided */
  if (ark_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    "ARKodeMem structure is NULL");
    return (ARK_MEM_NULL);
  }
  if (ark_mem->interp == NULL)
  {
    arkProcessError(ark_mem, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    "ARKodeInterpMem structure is NULL");
    return (ARK_MEM_NULL);
  }

  /* set the polynomial order based on tau input */
  if (tau <= tau_tol) { ord = 3; }
  else if (tau <= tau_tol2) { ord = 2; }
  else { ord = 1; }

  /* call the interpolation module to do the work */
  return (arkInterpEvaluate(ark_mem, ark_mem->interp, tau, 0, ord, yguess));
}